

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::handshake1(socks5 *this,error_code *e)

{
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  mutable_buffer local_30;
  
  if (this->m_abort == false) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_50._M_f = CONCAT71(local_50._M_f._1_7_,0x28);
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_50,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      local_30.data_ = &this->m_tmp_buf;
      local_30.size_ = 2;
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_50._M_f = (offset_in_socks5_to_subr)handshake2;
      local_50._8_8_ = 0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_60[0]._M_pi;
      local_68 = (element_type *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::
      async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,&local_30,&local_50,(type *)0x0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_50._M_bound_args.
                         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>
                         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>.
                         _M_head_impl.
                         super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> + 8
                 ));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
    }
  }
  return;
}

Assistant:

void socks5::handshake1(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_handshake1");
	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	ADD_OUTSTANDING_ASYNC("socks5::on_handshake2");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 2)
		, std::bind(&socks5::handshake2, self(), _1));
}